

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> * __thiscall
kj::ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_>::operator=
          (ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *this,
          ArrayBuilder<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *other)

{
  Orphan<capnproto_test::capnp::test::TestAllTypes> *pOVar1;
  RemoveConst<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *pRVar2;
  Orphan<capnproto_test::capnp::test::TestAllTypes> *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Orphan<capnproto_test::capnp::test::TestAllTypes> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)0x0;
    this->pos = (RemoveConst<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *)0x0;
    this->endPtr = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pOVar1,0x20,(long)pRVar2 - (long)pOVar1 >> 5,
               (long)pOVar3 - (long)pOVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_>::
               destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)0x0;
  other->pos = (RemoveConst<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_> *)0x0;
  other->endPtr = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }